

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

double ImGui::ScaleValueFromRatioT<double,double,double>
                 (ImGuiDataType data_type,float t,double v_min,double v_max,bool is_logarithmic,
                 float logarithmic_zero_epsilon,float zero_deadzone_halfsize)

{
  float fVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  bool bVar6;
  float fVar7;
  long lVar8;
  undefined1 auVar11 [16];
  long lVar9;
  double dVar10;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 in_register_00001204 [60];
  double __y;
  undefined1 in_register_00001248 [56];
  undefined1 auVar14 [64];
  float fVar15;
  undefined1 auVar16 [16];
  double __x;
  undefined1 in_register_00001288 [56];
  undefined1 auVar17 [64];
  undefined1 in_register_000012c4 [60];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  double local_28;
  
  auVar18._4_60_ = in_register_000012c4;
  auVar18._0_4_ = logarithmic_zero_epsilon;
  auVar17._8_56_ = in_register_00001288;
  auVar17._0_8_ = v_max;
  auVar14._8_56_ = in_register_00001248;
  auVar14._0_8_ = v_min;
  auVar12 = auVar14._0_16_;
  if ((v_min == v_max) && (!NAN(v_min) && !NAN(v_max))) {
    return v_min;
  }
  auVar16 = auVar17._0_16_;
  auVar13._8_8_ = in_register_00001204._4_8_;
  if (!is_logarithmic) {
    if ((data_type & 0xfffffffeU) == 8) {
      auVar13._0_8_ = (double)t;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = v_max - v_min;
      auVar12 = vfmadd213sd_fma(auVar13,auVar16,auVar12);
      return auVar12._0_8_;
    }
    if (1.0 <= t) {
      return v_max;
    }
    uVar2 = vcmpsd_avx512f(auVar16,auVar12,1);
    bVar3 = (bool)((byte)uVar2 & 1);
    return (v_max - v_min) * (double)t +
           (double)((ulong)bVar3 * -0x4020000000000000 + (ulong)!bVar3 * 0x3fe0000000000000) + v_min
    ;
  }
  if (t <= 0.0) {
    return v_min;
  }
  if (1.0 <= t) {
    return v_max;
  }
  bVar5 = v_max < v_min;
  auVar19._8_8_ = 0x7fffffffffffffff;
  auVar19._0_8_ = 0x7fffffffffffffff;
  auVar13 = vandpd_avx(auVar12,auVar19);
  auVar21._0_8_ = (double)logarithmic_zero_epsilon;
  auVar21._8_8_ = in_register_000012c4._4_8_;
  bVar6 = v_min < 0.0;
  auVar11._8_4_ = 0x80000000;
  auVar11._0_8_ = 0x8000000080000000;
  auVar11._12_4_ = 0x80000000;
  auVar11 = vxorps_avx512vl(auVar18._0_16_,auVar11);
  fVar7 = auVar11._0_4_;
  uVar2 = vcmpsd_avx512f(auVar13,auVar21,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  lVar8 = (ulong)bVar3 *
          (long)(double)(float)((uint)bVar6 * (int)fVar7 +
                               (uint)!bVar6 * (int)logarithmic_zero_epsilon) +
          (ulong)!bVar3 * (long)v_min;
  auVar13 = vandpd_avx(auVar16,auVar19);
  uVar2 = vcmpsd_avx512f(auVar13,auVar21,1);
  bVar3 = (bool)((byte)uVar2 & 1);
  lVar9 = (ulong)bVar3 *
          (long)(double)(float)((uint)(v_max < 0.0) * (int)fVar7 +
                               (uint)(v_max >= 0.0) * (int)logarithmic_zero_epsilon) +
          (ulong)!bVar3 * (long)v_max;
  dVar10 = (double)((ulong)bVar5 * lVar9 + (ulong)!bVar5 * lVar8);
  lVar8 = (ulong)bVar5 * lVar8 + (ulong)!bVar5 * lVar9;
  uVar2 = vcmpsd_avx512f(auVar16,ZEXT416(0) << 0x40,0);
  bVar3 = (bool)((byte)uVar2 & 1);
  local_28 = (double)((ulong)bVar6 * ((ulong)bVar3 * (long)(double)fVar7 + (ulong)!bVar3 * lVar8) +
                     (ulong)!bVar6 * lVar8);
  fVar7 = (float)((uint)bVar5 * (int)(1.0 - t) + (uint)!bVar5 * (int)t);
  if (0.0 <= v_min * v_max) {
    if ((v_min < 0.0) || (v_max < 0.0)) {
      __x = dVar10 / local_28;
      __y = (double)(1.0 - fVar7);
    }
    else {
      __x = local_28 / dVar10;
      __y = (double)fVar7;
      local_28 = dVar10;
    }
  }
  else {
    auVar12 = vminsd_avx(auVar12,auVar16);
    auVar20._0_4_ = (float)auVar12._0_8_;
    auVar20._4_12_ = auVar12._4_12_;
    auVar12._8_4_ = 0x80000000;
    auVar12._0_8_ = 0x8000000080000000;
    auVar12._12_4_ = 0x80000000;
    auVar12 = vxorps_avx512vl(auVar20,auVar12);
    auVar4._8_4_ = 0x7fffffff;
    auVar4._0_8_ = 0x7fffffff7fffffff;
    auVar4._12_4_ = 0x7fffffff;
    auVar13 = vandps_avx512vl(ZEXT416((uint)((float)v_max - (float)v_min)),auVar4);
    fVar15 = auVar12._0_4_ / auVar13._0_4_;
    fVar1 = fVar15 + zero_deadzone_halfsize;
    if ((fVar15 - zero_deadzone_halfsize <= fVar7) && (fVar7 <= fVar1)) {
      return 0.0;
    }
    if (fVar7 < fVar15) {
      dVar10 = pow(-dVar10 / auVar21._0_8_,(double)(1.0 - fVar7 / (fVar15 - zero_deadzone_halfsize))
                  );
      dVar10 = -dVar10;
      local_28 = auVar21._0_8_;
      goto LAB_003068e0;
    }
    __x = local_28 / auVar21._0_8_;
    __y = (double)((fVar7 - fVar1) / (1.0 - fVar1));
    local_28 = auVar21._0_8_;
  }
  dVar10 = pow(__x,__y);
LAB_003068e0:
  return dVar10 * local_28;
}

Assistant:

TYPE ImGui::ScaleValueFromRatioT(ImGuiDataType data_type, float t, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return v_min;
    const bool is_floating_point = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);

    TYPE result;
    if (is_logarithmic)
    {
        // We special-case the extents because otherwise our fudging can lead to "mathematically correct" but non-intuitive behaviors like a fully-left slider not actually reaching the minimum value
        if (t <= 0.0f)
            result = v_min;
        else if (t >= 1.0f)
            result = v_max;
        else
        {
            bool flipped = v_max < v_min; // Check if range is "backwards"

            // Fudge min/max to avoid getting silly results close to zero
            FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
            FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

            if (flipped)
                ImSwap(v_min_fudged, v_max_fudged);

            // Awkward special case - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
            if ((v_max == 0.0f) && (v_min < 0.0f))
                v_max_fudged = -logarithmic_zero_epsilon;

            float t_with_flip = flipped ? (1.0f - t) : t; // t, but flipped if necessary to account for us flipping the range

            if ((v_min * v_max) < 0.0f) // Range crosses zero, so we have to do this in two parts
            {
                float zero_point_center = (-(float)ImMin(v_min, v_max)) / ImAbs((float)v_max - (float)v_min); // The zero point in parametric space
                float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
                float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
                if (t_with_flip >= zero_point_snap_L && t_with_flip <= zero_point_snap_R)
                    result = (TYPE)0.0f; // Special case to make getting exactly zero possible (the epsilon prevents it otherwise)
                else if (t_with_flip < zero_point_center)
                    result = (TYPE)-(logarithmic_zero_epsilon * ImPow(-v_min_fudged / logarithmic_zero_epsilon, (FLOATTYPE)(1.0f - (t_with_flip / zero_point_snap_L))));
                else
                    result = (TYPE)(logarithmic_zero_epsilon * ImPow(v_max_fudged / logarithmic_zero_epsilon, (FLOATTYPE)((t_with_flip - zero_point_snap_R) / (1.0f - zero_point_snap_R))));
            }
            else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
                result = (TYPE)-(-v_max_fudged * ImPow(-v_min_fudged / -v_max_fudged, (FLOATTYPE)(1.0f - t_with_flip)));
            else
                result = (TYPE)(v_min_fudged * ImPow(v_max_fudged / v_min_fudged, (FLOATTYPE)t_with_flip));
        }
    }
    else
    {
        // Linear slider
        if (is_floating_point)
        {
            result = ImLerp(v_min, v_max, t);
        }
        else
        {
            // - For integer values we want the clicking position to match the grab box so we round above
            //   This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
            // - Not doing a *1.0 multiply at the end of a range as it tends to be lossy. While absolute aiming at a large s64/u64
            //   range is going to be imprecise anyway, with this check we at least make the edge values matches expected limits.
            if (t < 1.0)
            {
                FLOATTYPE v_new_off_f = (SIGNEDTYPE)(v_max - v_min) * t;
                result = (TYPE)((SIGNEDTYPE)v_min + (SIGNEDTYPE)(v_new_off_f + (FLOATTYPE)(v_min > v_max ? -0.5 : 0.5)));
            }
            else
            {
                result = v_max;
            }
        }
    }

    return result;
}